

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

void vkb::destroy_instance(Instance *instance)

{
  VkInstance pVVar1;
  
  pVVar1 = instance->instance;
  if (pVVar1 != (VkInstance)0x0) {
    if ((instance->debug_messenger != (VkDebugUtilsMessengerEXT)0x0) &&
       (detail::vulkan_functions()::v._112_8_ != 0)) {
      (*(code *)detail::vulkan_functions()::v._112_8_)
                (pVVar1,instance->debug_messenger,instance->allocation_callbacks);
      pVVar1 = instance->instance;
    }
    (*(code *)detail::vulkan_functions()::v._96_8_)(pVVar1,instance->allocation_callbacks);
    return;
  }
  return;
}

Assistant:

void destroy_instance(Instance const& instance) {
    if (instance.instance != VK_NULL_HANDLE) {
        if (instance.debug_messenger != VK_NULL_HANDLE)
            destroy_debug_utils_messenger(instance.instance, instance.debug_messenger, instance.allocation_callbacks);
        detail::vulkan_functions().fp_vkDestroyInstance(instance.instance, instance.allocation_callbacks);
    }
}